

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_simd.h
# Opt level: O1

void __thiscall ImplSimd<SimdSSE2>::AlphaBlend(ImplSimd<SimdSSE2> *this,RGB *rgb,uint8_t alpha)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  if ((rgb->size_ & 7) == 0) {
    if (rgb->size_ != 0) {
      puVar3 = rgb->r_;
      puVar4 = rgb->g_;
      puVar5 = rgb->b_;
      auVar7[1] = 0;
      auVar7[0] = alpha;
      auVar7[2] = alpha;
      auVar7[3] = 0;
      auVar7[4] = alpha;
      auVar7[5] = 0;
      auVar7[6] = alpha;
      auVar7[7] = 0;
      auVar7[8] = alpha;
      auVar7[9] = 0;
      auVar7[10] = alpha;
      auVar7[0xb] = 0;
      auVar7[0xc] = alpha;
      auVar7[0xd] = 0;
      auVar7[0xe] = alpha;
      auVar7[0xf] = 0;
      uVar6 = 0;
      do {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)(puVar3 + uVar6);
        auVar8 = vpmovzxbw_avx(auVar8);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)(puVar4 + uVar6);
        auVar1 = vpmovzxbw_avx(auVar1);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)(puVar5 + uVar6);
        auVar2 = vpmovzxbw_avx(auVar2);
        auVar8 = vpmullw_avx(auVar7,auVar8);
        auVar8 = vpsraw_avx(auVar8,8);
        auVar8 = vpacksswb_avx(auVar8,auVar8);
        *(long *)(puVar3 + uVar6) = auVar8._0_8_;
        auVar8 = vpmullw_avx(auVar7,auVar1);
        auVar8 = vpsraw_avx(auVar8,8);
        auVar8 = vpacksswb_avx(auVar8,auVar8);
        *(long *)(puVar4 + uVar6) = auVar8._0_8_;
        auVar8 = vpmullw_avx(auVar7,auVar2);
        auVar8 = vpsraw_avx(auVar8,8);
        auVar8 = vpacksswb_avx(auVar8,auVar8);
        *(long *)(puVar5 + uVar6) = auVar8._0_8_;
        uVar6 = uVar6 + 8;
      } while (uVar6 < rgb->size_);
    }
    return;
  }
  __assert_fail("rgb->size_ % kStride == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                ,0x5b,
                "virtual void ImplSimd<SimdSSE2>::AlphaBlend(RGB *, uint8_t) [SIMD = SimdSSE2]");
}

Assistant:

void ImplSimd<SIMD>::AlphaBlend(RGB *rgb, uint8_t alpha) {
  assert(rgb->size_ % kStride == 0);

  auto r = rgb->r_;
  auto g = rgb->g_;
  auto b = rgb->b_;

  Vector const_alpha = cn(alpha);

  for(size_t i = 0; i < rgb->size_; i += kStride){
    Vector c = load(r+i);
    Vector d = load(g+i);
    Vector e = load(b+i);
    /*
    r[i] = (uint32_t)alpha * r[i] >> 8;
    g[i] = (uint32_t)alpha * g[i] >> 8;
    b[i] = (uint32_t)alpha * b[i] >> 8;
     */
    store(rli(mul(const_alpha, c),8),r+i);
    store(rli(mul(const_alpha, d),8),g+i);
    store(rli(mul(const_alpha, e),8),b+i);
    SIMD::Empty();
  }
}